

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

void __thiscall Gluco::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  uint *puVar1;
  bool bVar2;
  bool bVar3;
  VarData *pVVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  vec<Gluco::Solver::Watcher> *pvVar8;
  long lVar9;
  ulong uVar10;
  
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::cleanAll
            (&this->watches);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::cleanAll
            (&this->watchesBin);
  if (0 < (this->vardata).sz) {
    lVar6 = 0;
    do {
      uVar10 = 0;
      bVar3 = true;
      do {
        bVar2 = bVar3;
        uVar10 = uVar10 | lVar6 * 2;
        pvVar8 = (this->watches).occs.data;
        if (0 < pvVar8[uVar10].sz) {
          pvVar8 = pvVar8 + uVar10;
          lVar9 = 0;
          lVar7 = 0;
          do {
            ClauseAllocator::reloc(&this->ca,(CRef *)((long)&pvVar8->data->cref + lVar9),to);
            lVar7 = lVar7 + 1;
            lVar9 = lVar9 + 8;
          } while (lVar7 < pvVar8->sz);
        }
        pvVar8 = (this->watchesBin).occs.data;
        if (0 < pvVar8[uVar10].sz) {
          pvVar8 = pvVar8 + uVar10;
          lVar7 = 0;
          lVar9 = 0;
          do {
            ClauseAllocator::reloc(&this->ca,(CRef *)((long)&pvVar8->data->cref + lVar7),to);
            lVar9 = lVar9 + 1;
            lVar7 = lVar7 + 8;
          } while (lVar9 < pvVar8->sz);
        }
        uVar10 = 1;
        bVar3 = false;
      } while (bVar2);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->vardata).sz);
  }
  if (0 < (this->trail).sz) {
    lVar6 = 0;
    do {
      pVVar4 = (this->vardata).data;
      iVar5 = (this->trail).data[lVar6].x >> 1;
      uVar10 = (ulong)pVVar4[iVar5].reason;
      if (uVar10 != 0xffffffff) {
        if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= pVVar4[iVar5].reason) {
          __assert_fail("r >= 0 && r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                        ,0x42,
                        "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        puVar1 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        if ((puVar1[uVar10] & 0x10) == 0) {
          bVar3 = locked(this,(Clause *)(puVar1 + uVar10));
          if (!bVar3) goto LAB_005c4785;
          pVVar4 = (this->vardata).data;
        }
        ClauseAllocator::reloc(&this->ca,&pVVar4[iVar5].reason,to);
      }
LAB_005c4785:
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->trail).sz);
  }
  if (0 < (this->learnts).sz) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->learnts).data + lVar7),to);
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 4;
    } while (lVar6 < (this->learnts).sz);
  }
  if (0 < (this->clauses).sz) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->clauses).data + lVar7),to);
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 4;
    } while (lVar6 < (this->clauses).sz);
  }
  return;
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    int v, s, i, j;
    // All watchers:
    //
    // for (int i = 0; i < watches.size(); i++)
    watches.cleanAll();
    watchesBin.cleanAll();
    for (v = 0; v < nVars(); v++)
        for (s = 0; s < 2; s++){
            Lit p = mkLit(v, s != 0);
            // printf(" >>> RELOCING: %s%d\n", sign(p)?"-":"", var(p)+1);
            vec<Watcher>& ws = watches[p];
            for (j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
            vec<Watcher>& ws2 = watchesBin[p];
            for (j = 0; j < ws2.size(); j++)
                ca.reloc(ws2[j].cref, to);
        }

    // All reasons:
    //
    for (i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)])))
            ca.reloc(vardata[v].reason, to);
    }

    // All learnt:
    //
    for (i = 0; i < learnts.size(); i++)
        ca.reloc(learnts[i], to);

    // All original:
    //
    for (i = 0; i < clauses.size(); i++)
        ca.reloc(clauses[i], to);
}